

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBase.h
# Opt level: O0

void __thiscall
adios2::format::BPBase::
Stats<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Stats
          (Stats<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  BPOpInfo *in_RDI;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xafb788);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xafb796);
  helper::BlockDivisionInfo::BlockDivisionInfo((BlockDivisionInfo *)in_RDI);
  (((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&in_RDI[1].Metadata)->_M_impl).
  super__Vector_impl_data._M_start = (pointer)0x0;
  (((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&in_RDI[1].Metadata)->_M_impl).
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&in_RDI[1].Metadata)->_M_impl).
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RDI[1].PreShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::__cxx11::string::string
            ((string *)
             &in_RDI[1].PreShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::string
            ((string *)
             &in_RDI[1].PreCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string((string *)&in_RDI[1].Type);
  in_RDI[1].PreDataType = '\0';
  in_RDI[1].IsActive = false;
  *(undefined2 *)&in_RDI[1].field_0x82 = 0;
  *(undefined4 *)&in_RDI[1].field_0x84 = 0;
  *(undefined4 *)&in_RDI[2].Metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl = 0;
  *(undefined4 *)
   &in_RDI[2].Metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x4 = 0;
  std::bitset<32UL>::bitset((bitset<32UL> *)0xafb83c);
  in_RDI[2].Metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 = 0;
  in_RDI[2].Metadata.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x11 = 0;
  BPOpInfo::BPOpInfo(in_RDI);
  return;
}

Assistant:

Stats() : Min(), Max(), Value() {}